

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pitch.c
# Opt level: O0

int pitch_segment_mix(mixed_segment *segment)

{
  float fVar1;
  uint local_34;
  uint32_t i;
  float mix;
  uint32_t samples;
  float *out;
  float *in;
  pitch_segment_data *data;
  mixed_segment *segment_local;
  
  in = (float *)segment->data;
  data = (pitch_segment_data *)segment;
  if ((in[0x19] != 1.0) || (NAN(in[0x19]))) {
    i = 0xffffffff;
    fVar1 = in[0x1a];
    mixed_buffer_request_read(&out,&i,*(mixed_buffer **)in);
    mixed_buffer_request_write((float **)&mix,&i,*(mixed_buffer **)(in + 2));
    fft_window_resolver(out,_mix,i,in + 4,fft_pitch_shift_resolver,in + 0x19);
    for (local_34 = 0; local_34 < i; local_34 = local_34 + 1) {
      _mix[local_34] = out[local_34] * (1.0 - fVar1) + _mix[local_34] * fVar1;
    }
    mixed_buffer_finish_read(i,*(mixed_buffer **)in);
    mixed_buffer_finish_write(i,*(mixed_buffer **)(in + 2));
  }
  else {
    mixed_buffer_transfer(*(mixed_buffer **)in,*(mixed_buffer **)(in + 2));
  }
  return 1;
}

Assistant:

int pitch_segment_mix(struct mixed_segment *segment){
  struct pitch_segment_data *data = (struct pitch_segment_data *)segment->data;

  if(data->pitch == 1.0){
    mixed_buffer_transfer(data->in, data->out);
  }else{
    float *restrict in, *restrict out;
    uint32_t samples = UINT32_MAX;
    float mix = data->mix;
    mixed_buffer_request_read(&in, &samples, data->in);
    mixed_buffer_request_write(&out, &samples, data->out);
    fft_window(in, out, samples, &data->fft_window_data, fft_pitch_shift, &data->pitch);
    for(uint32_t i=0; i<samples; ++i){
      out[i] = LERP(in[i], out[i], mix);
    }
    mixed_buffer_finish_read(samples, data->in);
    mixed_buffer_finish_write(samples, data->out);
  }
  return 1;
}